

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O1

ElementPtr __thiscall Rml::Element::RemoveChild(Element *this,Element *child)

{
  pointer puVar1;
  Element *stacking_context_parent;
  ElementDocument *this_00;
  Context *this_01;
  Element *pEVar2;
  Element *in_RDX;
  long lVar3;
  long lVar4;
  pointer puVar5;
  uint uVar6;
  bool bVar7;
  
  puVar5 = (child->children).
           super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (child->children).
           super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar5 != puVar1) {
    lVar4 = -(long)puVar5;
    lVar3 = 0;
    do {
      if ((puVar5->_M_t).super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
          super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
          super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl == in_RDX) {
        if (in_RDX == (Element *)0x0) goto LAB_0021be10;
        pEVar2 = in_RDX;
        uVar6 = 0;
        goto LAB_0021bde7;
      }
      puVar5 = puVar5 + 1;
      lVar3 = lVar3 + -1;
      lVar4 = lVar4 + -8;
    } while (puVar5 != puVar1);
  }
  (this->super_ScriptInterface).super_Releasable._vptr_Releasable = (_func_int **)0x0;
  return (ElementPtr)this;
  while (bVar7 = uVar6 < 2, uVar6 = uVar6 + 1, bVar7) {
LAB_0021bde7:
    (*(pEVar2->super_ScriptInterface).super_Releasable._vptr_Releasable[0x14])(pEVar2);
    pEVar2 = pEVar2->parent;
    if (pEVar2 == (Element *)0x0) break;
  }
LAB_0021be10:
  if ((ulong)(((long)(child->children).
                     super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(child->children).
                     super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) -
             (long)child->num_non_dom_children) <= (ulong)-lVar3) {
    child->num_non_dom_children = child->num_non_dom_children + -1;
  }
  (this->super_ScriptInterface).super_Releasable._vptr_Releasable =
       (_func_int **)
       (puVar5->_M_t).super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
       super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
       super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl;
  (puVar5->_M_t).super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
  super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
  super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl = (Element *)0x0;
  ::std::
  vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
  ::_M_erase(&child->children,(unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)-lVar4);
  if (child->focus == in_RDX) {
    child->focus = (Element *)0x0;
    this_00 = GetOwnerDocument(child);
    if (this_00 == (ElementDocument *)0x0) {
      this_01 = (Context *)0x0;
    }
    else {
      this_01 = ElementDocument::GetContext(this_00);
    }
    if (this_01 != (Context *)0x0) {
      for (pEVar2 = Context::GetFocusElement(this_01); pEVar2 != (Element *)0x0;
          pEVar2 = pEVar2->parent) {
        if (pEVar2 == in_RDX) {
          Focus(child,false);
          break;
        }
      }
    }
  }
  SetParent((Element *)(this->super_ScriptInterface).super_Releasable._vptr_Releasable,
            (Element *)0x0);
  (*(child->super_ScriptInterface).super_Releasable._vptr_Releasable[0x15])(child);
  pEVar2 = child;
  do {
    if (pEVar2->local_stacking_context != false) {
      pEVar2->stacking_context_dirty = true;
      break;
    }
    pEVar2 = pEVar2->parent;
  } while (pEVar2 != (Element *)0x0);
  child->field_0x17 = child->field_0x17 | 2;
  return (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)
         (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)this;
}

Assistant:

ElementPtr Element::RemoveChild(Element* child)
{
	size_t child_index = 0;

	for (auto itr = children.begin(); itr != children.end(); ++itr)
	{
		// Add the element to the delete list
		if (itr->get() == child)
		{
			Element* ancestor = child;
			for (int i = 0; i <= ChildNotifyLevels && ancestor; i++, ancestor = ancestor->GetParentNode())
				ancestor->OnChildRemove(child);

			if (child_index >= children.size() - num_non_dom_children)
				num_non_dom_children--;

			ElementPtr detached_child = std::move(*itr);
			children.erase(itr);

			// Remove the child element as the focused child of this element.
			if (child == focus)
			{
				focus = nullptr;

				// If this child (or a descendant of this child) is the context's currently
				// focused element, set the focus to us instead.
				if (Context* context = GetContext())
				{
					Element* focus_element = context->GetFocusElement();
					while (focus_element)
					{
						if (focus_element == child)
						{
							Focus();
							break;
						}

						focus_element = focus_element->GetParentNode();
					}
				}
			}

			detached_child->SetParent(nullptr);

			DirtyLayout();
			DirtyStackingContext();
			DirtyDefinition(DirtyNodes::Self);

			return detached_child;
		}

		child_index++;
	}

	return nullptr;
}